

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

int Nwk_ManPushBackwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Nwk_ObjVisitedTop(pObj);
  if (iVar1 != 0) {
    return 0;
  }
  Nwk_ObjSetVisitedTop(pObj);
  if ((pObj->field_0x20 & 0x10) != 0) {
    return 1;
  }
  lVar3 = 0;
  while ((lVar3 < pObj->nFanins && (pObj->pFanio[lVar3] != (Nwk_Obj_t *)0x0))) {
    iVar1 = Nwk_ManPushBackwardBot_rec(pObj->pFanio[lVar3],pPred);
    lVar3 = lVar3 + 1;
    if (iVar1 != 0) {
      return 1;
    }
  }
  for (lVar3 = 0; (int)lVar3 < pObj->nFanouts; lVar3 = lVar3 + 1) {
    uVar2 = *(uint *)&pObj->field_0x20;
    if (pObj->pFanio[pObj->nFanins + lVar3] == (Nwk_Obj_t *)0x0) goto LAB_003d7d8c;
    if (((uVar2 & 7) != 2) &&
       (iVar1 = Nwk_ManPushBackwardTop_rec(pObj->pFanio[pObj->nFanins + lVar3],pPred), iVar1 != 0))
    {
      return 1;
    }
  }
  uVar2 = *(uint *)&pObj->field_0x20;
LAB_003d7d8c:
  if ((uVar2 & 0x20) == 0) {
    return 0;
  }
  if ((Nwk_Obj_t *)pObj->pCopy != (Nwk_Obj_t *)0x0) {
    iVar1 = Nwk_ManPushBackwardBot_rec(pObj,(Nwk_Obj_t *)pObj->pCopy);
    if (iVar1 != 0) {
      pObj->field_0x20 = pObj->field_0x20 & 0xdf;
      pObj->pCopy = (void *)0x0;
      return 1;
    }
    return 0;
  }
  return 0;
}

Assistant:

int Nwk_ManPushBackwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushBackwardBot_rec( pNext, pPred ) )
            return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( !Nwk_ObjIsCo(pObj) && Nwk_ManPushBackwardTop_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) )
        if ( Nwk_ObjPred(pObj) && Nwk_ManPushBackwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}